

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match.h
# Opt level: O2

bool wasm::Match::Internal::
     Components<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_0,_wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>
     ::match(matched_t<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>_> *candidate,
            SubMatchers<wasm::Match::Internal::Matcher<wasm::Match::Internal::ExactKind<double>_>_>
            *matchers)

{
  matched_t<wasm::Match::Internal::ExactKind<double>_> *pmVar1;
  bool bVar2;
  Literal local_68;
  Literal local_50;
  double local_38;
  double local_30;
  GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_0> local_21;
  
  Literal::Literal(&local_50,candidate);
  local_30 = GetComponent<wasm::Match::Internal::LitKind<wasm::Match::Internal::FloatLK>,_0>::
             operator()(&local_21,&local_50);
  pmVar1 = (matchers->curr).binder;
  if (pmVar1 != (matched_t<wasm::Match::Internal::ExactKind<double>_> *)0x0) {
    *pmVar1 = local_30;
  }
  local_38 = (matchers->curr).data;
  if ((local_38 == local_30) && (!NAN(local_38) && !NAN(local_30))) {
    Literal::Literal(&local_68,candidate);
    Literal::~Literal(&local_68);
  }
  bVar2 = local_38 == local_30;
  Literal::~Literal(&local_50);
  return (bool)(-bVar2 & 1);
}

Assistant:

static inline bool
  match(matched_t<Kind> candidate,
        SubMatchers<CurrMatcher, NextMatchers...>& matchers) {
    return matchers.curr.matches(GetComponent<Kind, pos>{}(candidate)) &&
           Components<Kind, pos + 1, NextMatchers...>::match(candidate,
                                                             matchers.next);
  }